

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QWidgetList *
QWidgetPrivate::takeFromFocusChain
          (QWidgetList *__return_storage_ptr__,QWidget *from,QWidget *to,FocusDirection direction)

{
  QWidget *pQVar1;
  QWidget *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  QDebug QVar7;
  QWidget **ppQVar8;
  QWidgetData *pQVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QArrayData *d;
  QDebug local_b8;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined8 uStack_a4;
  undefined4 local_9c;
  char *local_98;
  QDebug local_90;
  undefined1 local_88 [8];
  QDebug local_80;
  QTextStream *local_78;
  undefined1 local_70 [8];
  QWidgetList local_68;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  focusPath(&local_68,from,to,direction);
  pQVar9 = (QWidgetData *)local_68.d.size;
  ppQVar8 = local_68.d.ptr;
  if ((QWidgetData *)local_68.d.size == (QWidgetData *)0x0) {
    lcWidgetFocus();
    if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_b0 = 2;
      uStack_ac = 0;
      uStack_a8 = 0;
      uStack_a4 = 0;
      local_9c = 0;
      local_98 = lcWidgetFocus::category.name;
      QMessageLogger::debug();
      QVar7.stream = local_90.stream;
      QVar11.m_data = (storage_type *)0x1f;
      QVar11.m_size = (qsizetype)local_48;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)local_48);
      if (local_48[0] != (QArrayData *)0x0) {
        LOCK();
        (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_90.stream,' ');
      }
      *(int *)((QTextStream *)local_90.stream + 0x28) =
           *(int *)((QTextStream *)local_90.stream + 0x28) + 1;
      ::operator<<((Stream *)&local_80,(QWidget *)local_88);
      QVar7.stream = local_80.stream;
      QVar12.m_data = (storage_type *)0x10;
      QVar12.m_size = (qsizetype)local_48;
      QString::fromUtf8(QVar12);
      QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)local_48);
      if (local_48[0] != (QArrayData *)0x0) {
        LOCK();
        (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      local_78 = (QTextStream *)local_80.stream;
      *(int *)(local_80.stream + 0x28) = *(int *)(local_80.stream + 0x28) + 1;
      ::operator<<((Stream *)local_70,(QWidget *)&local_78);
      QDebug::~QDebug((QDebug *)local_70);
      QDebug::~QDebug((QDebug *)&local_78);
      QDebug::~QDebug(&local_80);
      QDebug::~QDebug((QDebug *)local_88);
      QDebug::~QDebug(&local_90);
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QWidget **)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pQVar1 = *local_68.d.ptr;
    pQVar2 = local_68.d.ptr
             [(long)((long)&(((QWidgetData *)(local_68.d.size + -0x58))->wrect).y2.m_i + 3)];
    if (pQVar1 == pQVar2) {
      removeFromFocusChain(*(QWidgetPrivate **)&pQVar1->field_0x8,(FocusChainRemovalRules)0x0,Next);
      local_b0 = 0xaaaaaaaa;
      uStack_ac = 0xaaaaaaaa;
      ppQVar8 = (QWidget **)QArrayData::allocate((QArrayData **)&local_b0,8,0x10,1,KeepSize);
      (__return_storage_ptr__->d).d = (Data *)CONCAT44(uStack_ac,local_b0);
      (__return_storage_ptr__->d).ptr = ppQVar8;
      *ppQVar8 = pQVar1;
      (__return_storage_ptr__->d).size = 1;
    }
    else {
      lVar3 = *(long *)&pQVar2->field_0x8;
      lVar4 = *(long *)(lVar3 + 0x80);
      lVar5 = *(long *)&pQVar1->field_0x8;
      lVar6 = *(long *)(lVar5 + 0x88);
      *(long *)(*(long *)(lVar6 + 8) + 0x80) = lVar4;
      *(long *)(*(long *)(lVar4 + 8) + 0x88) = lVar6;
      *(QWidget **)(lVar5 + 0x88) = pQVar2;
      *(QWidget **)(lVar3 + 0x80) = pQVar1;
      lcWidgetFocus();
      if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
      {
        local_b0 = 2;
        uStack_ac = 0;
        uStack_a8 = 0;
        uStack_a4 = 0;
        local_9c = 0;
        local_98 = lcWidgetFocus::category.name;
        QMessageLogger::debug();
        local_48[0] = (QArrayData *)local_b8.stream;
        local_b8.stream = (Stream *)0x0;
        QtPrivate::printSequentialContainer<QList<QWidget*>>
                  ((QtPrivate *)&local_80,(Stream *)local_48,"QList",&local_68);
        QDebug::~QDebug((QDebug *)local_48);
        QVar7.stream = local_80.stream;
        QVar10.m_data = (storage_type *)0x18;
        QVar10.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar10);
        QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_80.stream,' ');
        }
        QDebug::~QDebug(&local_80);
        QDebug::~QDebug(&local_b8);
        pQVar9 = (QWidgetData *)local_68.d.size;
        ppQVar8 = local_68.d.ptr;
      }
      (__return_storage_ptr__->d).d = local_68.d.d;
      (__return_storage_ptr__->d).ptr = ppQVar8;
      (__return_storage_ptr__->d).size = (qsizetype)pQVar9;
      if ((QWidgetData *)local_68.d.d != (QWidgetData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
  }
  if ((QWidgetData *)local_68.d.d != (QWidgetData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetList QWidgetPrivate::takeFromFocusChain(QWidget *from,
                                               QWidget *to,
                                               FocusDirection direction)
{
    // Check if there is a path from->to in direction
    const QWidgetList path = focusPath(from, to , direction);
    if (path.isEmpty()) {
        qCDebug(lcWidgetFocus) << "No-op removal. Focus chain from" << from << "doesn't lead to " << to;
        return QWidgetList();
    }

    QWidget *first = path.constFirst();
    QWidget *last = path.constLast();
    if (first == last) {
        first->d_func()->removeFromFocusChain();
        return QWidgetList({first});
    }

    FOCUS_NEXT(FOCUS_PREV(first)) = FOCUS_NEXT(last);
    FOCUS_PREV(FOCUS_NEXT(last)) = FOCUS_PREV(first);
    FOCUS_PREV(first) = last;
    FOCUS_NEXT(last) = first;
    qCDebug(lcWidgetFocus) << path << "removed from focus chain";
    return path;
}